

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintFunctionMap.cpp
# Opt level: O2

void __thiscall wasm::PrintFunctionMap::run(PrintFunctionMap *this,Module *module)

{
  string *defaultValue;
  anon_class_16_2_94731fc3 visitor;
  anon_class_16_2_94731fc3 visitor_00;
  undefined1 local_370 [8];
  Output output;
  string outFile;
  Index i;
  allocator<char> local_1a;
  allocator<char> local_19;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)local_370,"symbolmap",&local_1a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(outFile.field_2._M_local_buf + 8),"",&local_19);
  defaultValue = (string *)((long)&outFile.field_2 + 8);
  Pass::getArgumentOrDefault
            ((string *)&output.field_0x308,&this->super_Pass,(string *)local_370,defaultValue);
  std::__cxx11::string::~string((string *)(outFile.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_370);
  Output::Output((Output *)local_370,(string *)&output.field_0x308,Text);
  outFile.field_2._8_4_ = 0;
  visitor.i = (Index *)defaultValue;
  visitor.o = (ostream *)((long)&outFile.field_2 + 8);
  wasm::ModuleUtils::
  iterImportedFunctions<wasm::PrintFunctionMap::run(wasm::Module*)::_lambda(wasm::Function*)_1_>
            ((ModuleUtils *)module,(Module *)&output.field_0x1f8,visitor);
  visitor_00.i = (Index *)defaultValue;
  visitor_00.o = (ostream *)((long)&outFile.field_2 + 8);
  wasm::ModuleUtils::
  iterDefinedFunctions<wasm::PrintFunctionMap::run(wasm::Module*)::_lambda(wasm::Function*)_1_>
            ((ModuleUtils *)module,(Module *)&output.field_0x1f8,visitor_00);
  Output::~Output((Output *)local_370);
  std::__cxx11::string::~string((string *)&output.field_0x308);
  return;
}

Assistant:

void run(Module* module) override {
    // If an argument is provided, write to that file; otherwise write to
    // stdout.
    auto outFile = getArgumentOrDefault("symbolmap", "");
    Output output(outFile, Flags::Text);
    auto& o = output.getStream();
    Index i = 0;
    auto write = [&](Function* func) {
      o << i++ << ':' << func->name.str << '\n';
    };
    ModuleUtils::iterImportedFunctions(*module, write);
    ModuleUtils::iterDefinedFunctions(*module, write);
  }